

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtCore.c
# Opt level: O2

int Cgt_ClockGatingRange(Cgt_Man_t *p,int iStart)

{
  int iVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  Aig_Man_t *p_00;
  Cnf_Dat_t *p_01;
  sat_solver *s;
  Vec_Ptr_t *vInfo;
  abctime aVar5;
  int nOutputs;
  int local_40;
  int local_3c;
  abctime local_38;
  
  local_38 = Abc_Clock();
  iVar1 = p->nCallsSat;
  iVar2 = p->nCallsUnsat;
  local_40 = p->nCallsUndec;
  local_3c = p->nCallsFiltered;
  aVar4 = Abc_Clock();
  p_00 = Cgt_ManDupPartition(p->pFrame,p->pPars->nVarsMin,p->pPars->nFlopsMin,iStart,p->pCare,
                             p->vSuppsInv,&nOutputs);
  p->pPart = p_00;
  p_01 = Cnf_DeriveSimple(p_00,nOutputs);
  p->pCnf = p_01;
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_01,1,0);
  p->pSat = s;
  if (s->qtail != s->qhead) {
    iVar3 = sat_solver_simplify(s);
    if (iVar3 == 0) {
      __assert_fail("RetValue != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                    ,0x102,"void sat_solver_compress(sat_solver *)");
    }
  }
  vInfo = Vec_PtrAllocSimInfo(p->pPart->vObjs->nSize,p->nPattWords);
  p->vPatts = vInfo;
  Vec_PtrCleanSimInfo(vInfo,0,p->nPattWords);
  aVar5 = Abc_Clock();
  p->timePrepare = p->timePrepare + (aVar5 - aVar4);
  Cgt_ClockGatingRangeCheck(p,iStart,nOutputs);
  if (p->pPars->fVeryVerbose != 0) {
    iVar3 = 0x80b84a;
    printf("%5d : D =%4d. C =%5d. Var =%6d. Pr =%5d. Cex =%5d. F =%4d. Saved =%6d. ",iStart,
           (ulong)(uint)nOutputs,(ulong)(uint)(p->pPart->nObjs[3] - nOutputs),
           (ulong)(uint)p->pSat->size,(ulong)(uint)(p->nCallsUnsat - iVar2),
           (ulong)(uint)(p->nCallsSat - iVar1),(ulong)(uint)(p->nCallsUndec - local_40),
           (ulong)(uint)(p->nCallsFiltered - local_3c));
    Abc_Print(iVar3,"%s =","Time");
    aVar4 = Abc_Clock();
    Abc_Print(iVar3,"%9.2f sec\n",(double)(aVar4 - local_38) / 1000000.0);
  }
  Cgt_ManClean(p);
  p->nRecycles = p->nRecycles + 1;
  return nOutputs + iStart;
}

Assistant:

int Cgt_ClockGatingRange( Cgt_Man_t * p, int iStart )
{
    int nOutputs, iStop;
    abctime clk, clkTotal = Abc_Clock();
    int nCallsUnsat    = p->nCallsUnsat;
    int nCallsSat      = p->nCallsSat;
    int nCallsUndec    = p->nCallsUndec;
    int nCallsFiltered = p->nCallsFiltered;
clk = Abc_Clock();
    p->pPart = Cgt_ManDupPartition( p->pFrame, p->pPars->nVarsMin, p->pPars->nFlopsMin, iStart, p->pCare, p->vSuppsInv, &nOutputs );
    p->pCnf  = Cnf_DeriveSimple( p->pPart, nOutputs );
    p->pSat  = (sat_solver *)Cnf_DataWriteIntoSolver( p->pCnf, 1, 0 );
    sat_solver_compress( p->pSat );
    p->vPatts = Vec_PtrAllocSimInfo( Aig_ManObjNumMax(p->pPart), p->nPattWords );
    Vec_PtrCleanSimInfo( p->vPatts, 0, p->nPattWords );
p->timePrepare += Abc_Clock() - clk;
    Cgt_ClockGatingRangeCheck( p, iStart, nOutputs );
    iStop = iStart + nOutputs;
    if ( p->pPars->fVeryVerbose )
    {
        printf( "%5d : D =%4d. C =%5d. Var =%6d. Pr =%5d. Cex =%5d. F =%4d. Saved =%6d. ",
            iStart, iStop-iStart, Aig_ManCoNum(p->pPart)-nOutputs, p->pSat->size, 
            p->nCallsUnsat-nCallsUnsat, 
            p->nCallsSat  -nCallsSat, 
            p->nCallsUndec-nCallsUndec,
            p->nCallsFiltered-nCallsFiltered );
        ABC_PRT( "Time", Abc_Clock() - clkTotal );
    }
    Cgt_ManClean( p );
    p->nRecycles++;
    return iStop;
}